

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex
          (ON_SubD_FixedSizeHeap *this,double *vertexP,uint edge_capacity)

{
  uint uVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdgePtr *pOVar3;
  ON_SubDVertex *__s;
  
  if (((this->m_v == (ON_SubDVertex *)0x0) || (this->m_v_capacity <= this->m_v_index)) ||
     (this->m_p_capacity < this->m_p_index + edge_capacity * 2)) {
LAB_0061e2d0:
    ON_SubDIncrementErrorCount();
    __s = (ON_SubDVertex *)0x0;
  }
  else {
    if (edge_capacity == 0) {
      pOVar3 = (ON_SubDEdgePtr *)0x0;
    }
    else if ((0xffff < edge_capacity) ||
            (pOVar3 = (ON_SubDEdgePtr *)AllocatePtrArray(this,edge_capacity * 2,true),
            pOVar3 == (ON_SubDEdgePtr *)0x0)) goto LAB_0061e2d0;
    __s = this->m_v + this->m_v_index;
    memset(__s,0,0x108);
    uVar1 = this->m_v_index;
    if (uVar1 != 0) {
      pOVar2 = this->m_v;
      pOVar2[uVar1 - 1].m_next_vertex = __s;
      __s->m_prev_vertex = pOVar2 + (uVar1 - 1);
    }
    this->m_v_index = uVar1 + 1;
    (__s->super_ON_SubDComponentBase).m_id = uVar1 + 1;
    if (vertexP != (double *)0x0) {
      __s->m_P[0] = *vertexP;
      __s->m_P[1] = vertexP[1];
      __s->m_P[2] = vertexP[2];
    }
    if (edge_capacity != 0) {
      __s->m_edge_capacity = (unsigned_short)edge_capacity;
      __s->m_edges = pOVar3;
      __s->m_face_capacity = (unsigned_short)edge_capacity;
      __s->m_faces = (ON_SubDFace **)(pOVar3 + edge_capacity);
    }
  }
  return __s;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const double vertexP[3],
  unsigned int edge_capacity
  )
{
  if (nullptr == m_v || m_v_index >= m_v_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned int face_capacity = edge_capacity;

  if (edge_capacity + face_capacity + m_p_index > m_p_capacity )
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR* a = nullptr;
  if (0 != edge_capacity || 0 != face_capacity)
  {
    if ( edge_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    if ( face_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    a = AllocatePtrArray(edge_capacity + face_capacity, true);
    if (nullptr == a)
      return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDVertex* v = m_v + m_v_index;
  memset(v, 0, sizeof(*v));
  if (m_v_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on
    // m_next_vertex being set this way.
    m_v[m_v_index - 1].m_next_vertex = v;
    v->m_prev_vertex = &m_v[m_v_index - 1];
  }
  v->m_id = ++m_v_index;

  if (nullptr != vertexP)
  {
    v->m_P[0] = vertexP[0];
    v->m_P[1] = vertexP[1];
    v->m_P[2] = vertexP[2];
  }

  if (edge_capacity > 0)
  {
    v->m_edge_capacity = (unsigned short)edge_capacity;
    v->m_edges = (ON_SubDEdgePtr*)a;
    a += edge_capacity;
  }
  if (face_capacity > 0)
  {
    v->m_face_capacity = (unsigned short)face_capacity;
    v->m_faces = (const ON_SubDFace**)a;
  }
  a = 0;

  return v;
}